

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcUShapeProfileDef::~IfcUShapeProfileDef(IfcUShapeProfileDef *this)

{
  code *pcVar1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  pcVar1 = p_Var2 + 0x10 +
           (long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr.
                  _M_dataplus;
  *(undefined8 *)(pcVar1 + -0x40) = 0x9a6dd8;
  *(undefined8 *)(pcVar1 + 0xa0) = 0x9a6e00;
  if (*(code **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(code **)(pcVar1 + -0x10));
  }
  pvVar3 = *(void **)(&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10 +
                     (long)p_Var2);
  if ((undefined1 *)pvVar3 !=
      &(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20 + (long)p_Var2) {
    operator_delete(pvVar3);
    return;
  }
  return;
}

Assistant:

IfcUShapeProfileDef() : Object("IfcUShapeProfileDef") {}